

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_port.c
# Opt level: O0

csp_callback_t csp_port_get_callback(uint port)

{
  uint port_local;
  anon_union_8_2_430c832f_for_csp_port_t_1 local_8;
  
  if (port < 0x11) {
    if (ports[port].state == PORT_OPEN_CB) {
      local_8 = (anon_union_8_2_430c832f_for_csp_port_t_1)ports[port].field_1.socket;
    }
    else if (ports[port].state == PORT_OPEN) {
      local_8.socket = (csp_socket_t *)0x0;
    }
    else if (ports[0x11].state == PORT_OPEN_CB) {
      local_8 = ports[0x11].field_1;
    }
    else {
      local_8.socket = (csp_socket_t *)0x0;
    }
  }
  else {
    local_8.socket = (csp_socket_t *)0x0;
  }
  return (csp_callback_t)local_8.socket;
}

Assistant:

csp_callback_t csp_port_get_callback(unsigned int port) {

	if (port > CSP_PORT_MAX_BIND) {
		return NULL;
	}

	/* Check if port is open callback */
	if (ports[port].state == PORT_OPEN_CB) {
		return ports[port].callback;
	}

	/* If it's open socket, then return no callback */
	if (ports[port].state == PORT_OPEN) {
		return NULL;
	}

	/* Otherwise check if we have a match all callback */
	if (ports[CSP_PORT_MAX_BIND + 1].state == PORT_OPEN_CB) {
		return ports[CSP_PORT_MAX_BIND + 1].callback;
	}

	return NULL;
}